

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase1816::run(TestCase1816 *this)

{
  StructDataBitCount *this_00;
  float fVar1;
  float local_14c;
  float local_148;
  bool local_141;
  float local_140;
  float fStack_13c;
  bool _kj_shouldLog_1;
  bool local_135;
  bool _kj_shouldLog;
  undefined1 local_128 [8];
  Builder root;
  MallocMessageBuilder message;
  TestCase1816 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestWholeFloatDefault>
            ((Builder *)local_128,(MessageBuilder *)this_00);
  fVar1 = capnproto_test::capnp::test::TestWholeFloatDefault::Builder::getField
                    ((Builder *)local_128);
  if ((fVar1 != 123.0) || (NAN(fVar1))) {
    local_135 = kj::_::Debug::shouldLog(ERROR);
    while (local_135 != false) {
      fStack_13c = 123.0;
      local_140 = capnproto_test::capnp::test::TestWholeFloatDefault::Builder::getField
                            ((Builder *)local_128);
      kj::_::Debug::log<char_const(&)[47],float,float>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x71c,ERROR,
                 "\"failed: expected \" \"(123.0f) == (root.getField())\", 123.0f, root.getField()",
                 (char (*) [47])"failed: expected (123.0f) == (root.getField())",
                 &stack0xfffffffffffffec4,&local_140);
      local_135 = false;
    }
  }
  fVar1 = capnproto_test::capnp::test::TestWholeFloatDefault::Builder::getBigField
                    ((Builder *)local_128);
  if ((fVar1 != 2e+30) || (NAN(fVar1))) {
    local_141 = kj::_::Debug::shouldLog(ERROR);
    while (local_141 != false) {
      local_148 = 2e+30;
      local_14c = capnproto_test::capnp::test::TestWholeFloatDefault::Builder::getBigField
                            ((Builder *)local_128);
      kj::_::Debug::log<char_const(&)[49],float,float>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x71d,ERROR,
                 "\"failed: expected \" \"(2e30f) == (root.getBigField())\", 2e30f, root.getBigField()"
                 ,(char (*) [49])"failed: expected (2e30f) == (root.getBigField())",&local_148,
                 &local_14c);
      local_141 = false;
    }
  }
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(Encoding, WholeFloatDefault) {
  MallocMessageBuilder message;
  auto root = message.initRoot<test::TestWholeFloatDefault>();

  EXPECT_EQ(123.0f, root.getField());
  EXPECT_EQ(2e30f, root.getBigField());
  EXPECT_EQ(456.0f, test::TestWholeFloatDefault::CONSTANT);
  EXPECT_EQ(4e30f, test::TestWholeFloatDefault::BIG_CONSTANT);
}